

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall
gmlc::networking::TcpServer::handle_accept(TcpServer *this,pointer *acc,pointer *new_connection)

{
  __int_type_conflict1 _Var1;
  element_type *peVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TcpConnection *pTVar5;
  TcpAcceptor *this_00;
  int iVar6;
  _Any_data *p_Var7;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  undefined1 *puVar8;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_b0;
  undefined1 local_a0 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  _Any_data local_70;
  code *local_60;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  local_50;
  
  peVar2 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar3 = (peVar2->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (*peVar3->_vptr_Socket[0xe])(peVar3,1,0);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  peVar2 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar3 = (peVar2->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar2->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  iVar6 = 1;
  (*peVar3->_vptr_Socket[0xc])();
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  pTVar5 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((this->halted)._M_base._M_i & 1U) != 0) {
    TcpConnection::close(pTVar5,iVar6);
    return;
  }
  peVar3 = (pTVar5->socket_).
           super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3->handshake_server_ = true;
  (*peVar3->_vptr_Socket[6])();
  pTVar5 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  ::function(&local_50,&this->dataCall);
  TcpConnection::setDataCall(pTVar5,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)(&local_50,&local_50,3);
  }
  pTVar5 = (new_connection->
           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var7 = &local_70;
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
  function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
            *)p_Var7,&this->errorCall);
  TcpConnection::setErrorCall
            (pTVar5,(function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                     *)p_Var7);
  iVar6 = (int)p_Var7;
  if (local_60 != (code *)0x0) {
    p_Var7 = &local_70;
    (*local_60)(p_Var7,p_Var7,__destroy_functor);
    iVar6 = (int)p_Var7;
  }
  if ((this->logFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
    pTVar5 = (new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    this_01 = (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)(local_a0 + 0x10);
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(this_01,&this->logFunction);
    TcpConnection::setLoggingFunction(pTVar5,this_01);
    iVar6 = (int)this_01;
    if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      puVar8 = local_a0 + 0x10;
      (*(code *)local_80._M_pi)(puVar8,puVar8,3);
      iVar6 = (int)puVar8;
    }
  }
  TcpConnection::startReceive
            ((new_connection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            );
  local_b0._M_device = &this->accepting;
  local_b0._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_b0);
  local_b0._M_owns = true;
  _Var1 = (this->halted)._M_base._M_i;
  if ((_Var1 & 1U) == 0) {
    std::
    vector<std::shared_ptr<gmlc::networking::TcpConnection>,std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>>>
    ::emplace_back<std::shared_ptr<gmlc::networking::TcpConnection>>
              ((vector<std::shared_ptr<gmlc::networking::TcpConnection>,std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>>>
                *)&this->connections,new_connection);
  }
  else {
    std::unique_lock<std::mutex>::unlock(&local_b0);
    TcpConnection::close
              ((new_connection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,iVar6);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_b0);
  if ((_Var1 & 1U) == 0) {
    this_00 = (acc->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    TcpConnection::create
              ((TcpConnection *)local_a0,&this->socket_factory,this->ioctx,this->bufferSize);
    TcpAcceptor::start(this_00,(pointer *)local_a0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    }
  }
  return;
}

Assistant:

void TcpServer::handle_accept(
    TcpAcceptor::pointer acc,
    TcpConnection::pointer new_connection)
{
    /*setting linger to 1 second*/
    new_connection->socket()->set_option_linger(true, 0);
    new_connection->socket()->set_option_no_delay(true);
    // Set options here
    if (halted.load()) {
        new_connection->close();
        return;
    }

    new_connection->setHandshakeModeServer();
    new_connection->handshake();

    new_connection->setDataCall(dataCall);
    new_connection->setErrorCall(errorCall);
    if (logFunction) {
        new_connection->setLoggingFunction(logFunction);
    }
    new_connection->startReceive();
    {  // scope for the lock_guard

        std::unique_lock<std::mutex> lock(accepting);
        if (!halted.load()) {
            connections.push_back(std::move(new_connection));
        } else {
            lock.unlock();
            new_connection->close();
            return;
        }
    }
    acc->start(TcpConnection::create(socket_factory, ioctx, bufferSize));
}